

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidSoftmax2(void)

{
  RepeatedField<long> *this;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  SoftmaxLayerParams *pSVar13;
  ostream *poVar14;
  undefined8 *puVar15;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar16;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar17;
  uint uVar18;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar17 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar17);
  }
  pRVar3 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00178824:
    pRVar16 = &(local_80.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar16->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar16->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar1 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00178824;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  puVar15 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar15 = (undefined8 *)*puVar15;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar15);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar17 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar17);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar17 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar17);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 5;
  }
  uVar18 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar18;
  if (uVar18 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar18] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar18] = 5;
  }
  this->current_size_ = uVar2 + 2;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar17 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar17);
  }
  pRVar3 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0017899b:
    pRVar16 = &(local_80.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar16->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar16->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar1 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0017899b;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  puVar15 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar15 = (undefined8 *)*puVar15;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"probs",puVar15);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar17 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar17);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar17 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar17);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar17 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar17);
  }
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00178a9c:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar10);
  }
  else {
    iVar1 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00178a9c;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
  puVar15 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar15 = (undefined8 *)*puVar15;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar10->name_,"softmax",puVar15);
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00178af7:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar1 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00178af7;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar12 = pRVar3->elements[iVar1];
      goto LAB_00178b61;
    }
  }
  pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
LAB_00178b61:
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3977ad);
  if (pNVar10->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0xaf;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar17 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar17 = *(Arena **)pAVar17;
    }
    pSVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SoftmaxLayerParams>
                        (pAVar17);
    (pNVar10->layer_).softmax_ = pSVar13;
  }
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar5 = CoreML::Result::good(&local_50);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xcf7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)bVar5;
}

Assistant:

int testInvalidSoftmax2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    // rank must be at least length 3
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->set_name("softmax");
    layer->add_input("input");
    layer->add_output("probs");
    (void) layer->mutable_softmax();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}